

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O0

int Ronan::mystrnicmp1(char *a,char *b)

{
  bool bVar1;
  int local_2c;
  int local_24;
  byte *pbStack_20;
  int l;
  char *b_local;
  char *a_local;
  
  local_24 = 0;
  pbStack_20 = (byte *)b;
  b_local = a;
  while( true ) {
    bVar1 = false;
    if (*b_local != '\0') {
      bVar1 = *pbStack_20 != 0;
    }
    if (!bVar1) break;
    if ((byte)(*b_local | 0x20U) != (*pbStack_20 | 0x20)) {
      return 0;
    }
    local_24 = local_24 + 1;
    pbStack_20 = pbStack_20 + 1;
    b_local = b_local + 1;
  }
  if (*b_local == '\0') {
    local_2c = local_24;
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

int mystrnicmp1(const char *a, const char *b)
{
    int l = 0;
    while (*a && *b)
        if ((*a++ | 0x20) != (*b++ | 0x20))
            return 0;
        else
            l++;
    return *a ? 0 : l;
}